

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

bool __thiscall Json::Reader::decodeNumber(Reader *this,Token *token)

{
  char cVar1;
  byte bVar2;
  char *pcVar3;
  long lVar4;
  bool bVar5;
  long *plVar6;
  _Elt_pointer ppVVar7;
  long lVar8;
  long *plVar9;
  ulong uVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  bool bVar12;
  ulong uVar13;
  uint uVar14;
  byte *pbVar15;
  ulong value;
  ValueHolder local_98;
  long local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  long *local_58 [2];
  long local_48 [2];
  ulong local_38;
  
  pcVar3 = token->start_;
  if (pcVar3 == token->end_) {
    bVar5 = false;
  }
  else {
    lVar8 = 0;
    bVar12 = false;
    do {
      bVar5 = true;
      if (!bVar12) {
        uVar14 = (byte)pcVar3[lVar8] - 0x2b;
        if (uVar14 < 0x3b) {
          if ((0x400000004000009U >> ((ulong)uVar14 & 0x3f) & 1) == 0) {
            if ((ulong)uVar14 != 2) goto LAB_001533c9;
            bVar5 = lVar8 != 0;
          }
        }
        else {
LAB_001533c9:
          bVar5 = false;
        }
      }
      lVar4 = lVar8 + 1;
      lVar8 = lVar8 + 1;
      bVar12 = bVar5;
    } while (pcVar3 + lVar4 != token->end_);
  }
  if (bVar5) {
    bVar5 = decodeDouble(this,token);
    return bVar5;
  }
  cVar1 = *pcVar3;
  value = 0;
  if (cVar1 == '-') {
    uVar13 = 0x8000000000000000;
  }
  else {
    uVar13 = 0xffffffffffffffff;
  }
  pbVar15 = (byte *)(pcVar3 + (cVar1 == '-'));
  bVar5 = false;
  local_38 = uVar13 % 10;
  do {
    if (token->end_ <= pbVar15) {
      if (cVar1 == '-') {
        Value::Value((Value *)&local_98,-value);
        ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (ppVVar7 ==
            (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVVar7 = (this->nodes_).c.
                    super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        Value::operator=(ppVVar7[-1],(Value *)&local_98);
      }
      else if (value < 0x80000000) {
        Value::Value((Value *)&local_98,value);
        ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (ppVVar7 ==
            (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVVar7 = (this->nodes_).c.
                    super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        Value::operator=(ppVVar7[-1],(Value *)&local_98);
      }
      else {
        Value::Value((Value *)&local_98,value);
        ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (ppVVar7 ==
            (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVVar7 = (this->nodes_).c.
                    super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        Value::operator=(ppVVar7[-1],(Value *)&local_98);
      }
      Value::~Value((Value *)&local_98);
      return true;
    }
    bVar2 = *pbVar15;
    pbVar15 = pbVar15 + 1;
    if ((byte)(bVar2 - 0x3a) < 0xf6) {
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_58);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,0x18a9a1);
      local_78 = &local_68;
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_68 = *plVar9;
        lStack_60 = plVar6[3];
      }
      else {
        local_68 = *plVar9;
        local_78 = (long *)*plVar6;
      }
      local_70 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_78);
      local_98.string_ = (char *)&local_88;
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 == paVar11) {
        local_88._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_88._8_8_ = plVar6[3];
      }
      else {
        local_88._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_98.string_ = ((char *)*plVar6).string_;
      }
      local_90 = plVar6[1];
      *plVar6 = (long)paVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      addError(this,(string *)&local_98,token,(Location)0x0);
      if (local_98 != &local_88) {
        operator_delete(local_98.string_,local_88._M_allocated_capacity + 1);
      }
      if (local_78 != &local_68) {
        operator_delete(local_78,local_68 + 1);
      }
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      bVar12 = false;
      bVar5 = false;
    }
    else {
      uVar10 = (ulong)(bVar2 - 0x30);
      if ((value < uVar13 / 10) ||
         (((value <= uVar13 / 10 && (pbVar15 == (byte *)token->end_)) && (uVar10 <= local_38)))) {
        value = uVar10 + value * 10;
        bVar12 = true;
      }
      else {
        bVar5 = decodeDouble(this,token);
        bVar12 = false;
      }
    }
  } while (bVar12);
  return bVar5;
}

Assistant:

bool 
Reader::decodeNumber( Token &token )
{
   bool isDouble = false;
   for ( Location inspect = token.start_; inspect != token.end_; ++inspect )
   {
      isDouble = isDouble  
                 ||  in( *inspect, '.', 'e', 'E', '+' )  
                 ||  ( *inspect == '-'  &&  inspect != token.start_ );
   }
   if ( isDouble )
      return decodeDouble( token );
   // Attempts to parse the number as an integer. If the number is
   // larger than the maximum supported value of an integer then
   // we decode the number as a double.
   Location current = token.start_;
   bool isNegative = *current == '-';
   if ( isNegative )
      ++current;
   Value::LargestUInt maxIntegerValue = isNegative ? Value::LargestUInt(-Value::minLargestInt) 
                                                   : Value::maxLargestUInt;
   Value::LargestUInt threshold = maxIntegerValue / 10;
   Value::LargestUInt value = 0;
   while ( current < token.end_ )
   {
      Char c = *current++;
      if ( c < '0'  ||  c > '9' )
         return addError( "'" + std::string( token.start_, token.end_ ) + "' is not a number.", token );
      Value::UInt digit(c - '0');
      if ( value >= threshold )
      {
         // We've hit or exceeded the max value divided by 10 (rounded down). If
         // a) we've only just touched the limit, b) this is the last digit, and
         // c) it's small enough to fit in that rounding delta, we're okay.
         // Otherwise treat this number as a double to avoid overflow.
         if (value > threshold ||
             current != token.end_ ||
             digit > maxIntegerValue % 10)
         {
            return decodeDouble( token );
         }
      }
      value = value * 10 + digit;
   }
   if ( isNegative )
      currentValue() = -Value::LargestInt( value );
   else if ( value <= Value::LargestUInt(Value::maxInt) )
      currentValue() = Value::LargestInt( value );
   else
      currentValue() = value;
   return true;
}